

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_revision(lys_ypr_ctx_conflict *pctx,lysp_revision *rev)

{
  lysp_revision *rev_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  if (((rev->dsc == (char *)0x0) && (rev->ref == (char *)0x0)) &&
     (rev->exts == (lysp_ext_instance *)0x0)) {
    ypr_open(pctx,"revision","date",rev->date,-1);
  }
  else {
    ypr_open(pctx,"revision","date",rev->date,'\x01');
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
    yprp_extension_instances(pctx,LY_STMT_REVISION,'\0',rev->exts,(int8_t *)0x0);
    ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',rev->dsc,rev->exts);
    ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',rev->ref,rev->exts);
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
    ypr_close(pctx,"revision",'\x01');
  }
  return;
}

Assistant:

static void
yprp_revision(struct lys_ypr_ctx *pctx, const struct lysp_revision *rev)
{
    if (rev->dsc || rev->ref || rev->exts) {
        ly_print_(pctx->out, "%*srevision %s {\n", INDENT, rev->date);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_REVISION, 0, rev->exts, NULL);
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, rev->dsc, 0, rev->exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, rev->ref, 0, rev->exts);
        LEVEL--;
        ly_print_(pctx->out, "%*s}\n", INDENT);
    } else {
        ly_print_(pctx->out, "%*srevision %s;\n", INDENT, rev->date);
    }
}